

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mei.c
# Opt level: O2

int mei_fwstatus(mei *me,uint32_t fwsts_num,uint32_t *fwsts)

{
  long lVar1;
  mei_log_callback p_Var2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  ssize_t sVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  long in_FS_OFFSET;
  char local_71 [9];
  char path [33];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar9 = 0xffffffea;
  if (fwsts == (uint32_t *)0x0 || me == (mei *)0x0) goto LAB_00120ada;
  if (5 < fwsts_num) {
    if (me->log_level != MEI_LOG_LEVEL_QUIET) {
      if (me->log_callback == (mei_log_callback)0x0) {
        __syslog_chk(3,1,"me: error: FW status number should be 0..5\n");
      }
      else {
        (*me->log_callback)(true,"me: error: FW status number should be 0..5\n");
      }
    }
    goto LAB_00120ada;
  }
  if (me->device == (char *)0x0) {
    pcVar4 = "/dev/mei0";
  }
  else {
    pcVar4 = strstr(me->device,"/dev/");
    if (pcVar4 == (char *)0x0) {
      if (me->log_level != MEI_LOG_LEVEL_QUIET) {
        if (me->log_callback == (mei_log_callback)0x0) {
          __syslog_chk(3,1,"me: error: Device does not start with \'%s\'\n","/dev/");
        }
        else {
          (*me->log_callback)(true,"me: error: Device does not start with \'%s\'\n","/dev/");
        }
      }
      goto LAB_00120ada;
    }
  }
  iVar3 = __snprintf_chk(path,0x21,1,0x21,"/sys/class/mei/%s/fw_status",pcVar4 + 5);
  if (iVar3 < 0) {
    uVar8 = 0xffffffea;
  }
  else {
    path[0x20] = '\0';
    piVar5 = __errno_location();
    *piVar5 = 0;
    iVar3 = open(path,0x80000,0);
    if (iVar3 == -1) {
      iVar3 = *piVar5;
LAB_00120a87:
      me->last_err = iVar3;
    }
    else {
      *piVar5 = 0;
      sVar6 = pread(iVar3,local_71,9,(ulong)(fwsts_num * 9));
      if (sVar6 != -1) {
        close(iVar3);
        if (sVar6 < 9) {
          me->last_err = 0x47;
          uVar8 = 0xffffffb9;
          goto LAB_00120a91;
        }
        *piVar5 = 0;
        uVar7 = strtoul(local_71,(char **)0x0,0x10);
        iVar3 = *piVar5;
        if (iVar3 == 0) {
          *fwsts = (uint32_t)uVar7;
          uVar9 = 0;
          goto LAB_00120ada;
        }
        goto LAB_00120a87;
      }
      me->last_err = *piVar5;
      close(iVar3);
      iVar3 = me->last_err;
    }
    uVar8 = -iVar3;
    uVar9 = 0;
    if (-1 < (int)uVar8) goto LAB_00120ada;
  }
LAB_00120a91:
  uVar9 = uVar8;
  if (me->log_level != MEI_LOG_LEVEL_QUIET) {
    p_Var2 = me->log_callback;
    pcVar4 = strerror(-uVar8);
    if (p_Var2 == (mei_log_callback)0x0) {
      __syslog_chk(3,1,"me: error: Cannot get FW status [%d]:%s\n",uVar8,pcVar4);
    }
    else {
      (*p_Var2)(true,"me: error: Cannot get FW status [%d]:%s\n",(ulong)uVar8,pcVar4);
    }
  }
LAB_00120ada:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar9;
  }
  __stack_chk_fail();
}

Assistant:

int mei_fwstatus(struct mei *me, uint32_t fwsts_num, uint32_t *fwsts)
{
	char *device;
	int rc;

	if (!me || !fwsts)
		return -EINVAL;

	if (fwsts_num > MAX_FW_STATUS_NUM) {
		mei_err(me, "FW status number should be 0..5\n");
		return -EINVAL;
	}

	if (me->device) {
		device = strstr(me->device, MEI_DEFAULT_DEVICE_PREFIX);
		if (!device) {
			mei_err(me, "Device does not start with '%s'\n",
				MEI_DEFAULT_DEVICE_PREFIX);
			return -EINVAL;
		}
		device += strlen(MEI_DEFAULT_DEVICE_PREFIX);
	} else {
		device = MEI_DEFAULT_DEVICE_NAME;
	}
	rc = __mei_fwsts(me, device, fwsts_num, fwsts);
	if (rc < 0) {
		mei_err(me, "Cannot get FW status [%d]:%s\n",
			rc, strerror(-rc));
		return rc;
	}

	return 0;
}